

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O2

adh_node_t * adh_search_leaf_by_encoding(bit_array_t *bit_array)

{
  long lVar1;
  adh_node_t **ppaVar2;
  adh_node_t *paVar3;
  ulong uVar4;
  
  uVar4 = (ulong)bit_array->length;
  ppaVar2 = &adh_root_node;
  while ((paVar3 = *ppaVar2, 0 < (long)uVar4 && (paVar3 != (adh_node_t *)0x0))) {
    lVar1 = uVar4 - 1;
    uVar4 = uVar4 - 1;
    ppaVar2 = (adh_node_t **)
              ((paVar3->bit_array).buffer + (ulong)(bit_array->buffer[lVar1] == '1') * 8 + -0x1a);
  }
  if ((paVar3 == (adh_node_t *)0x0) ||
     ((paVar3->right != (adh_node *)0x0 || (paVar3->left != (adh_node *)0x0)))) {
    paVar3 = (adh_node_t *)0x0;
  }
  return paVar3;
}

Assistant:

adh_node_t* adh_search_leaf_by_encoding(const bit_array_t *bit_array) {
    adh_node_t* nextNode = adh_root_node;
    for(int i = bit_array->length-1; i >= 0 && nextNode; i--) {
        if(bit_array->buffer[i] == BIT_1) {
            nextNode = nextNode->right;
        } else
            nextNode = nextNode->left;
    }

    // if it's a leaf return it
    if(nextNode && nextNode->right == NULL && nextNode->left == NULL)
        return nextNode;

    return NULL;
}